

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_55(QPDF *pdf,char *arg2)

{
  long lVar1;
  allocator<char> local_91;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88 [3];
  QPDF *local_70;
  QPDFObjectHandle qtest;
  string local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  long local_40;
  
  local_70 = pdf;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w);
  QPDFObjectHandle::newArray();
  for (lVar1 = _pages; lVar1 != local_40; lVar1 = lVar1 + 0x38) {
    QPDFPageObjectHelper::getFormXObjectForPage(SUB81(&w,0));
    QPDFObjectHandle::appendItem(&qtest);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_88);
    QPDFPageObjectHelper::getFormXObjectForPage(SUB81(&w,0));
    QPDFObjectHandle::appendItem(&qtest);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_88);
  }
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/QTest",&local_91);
  QPDFObjectHandle::replaceKey(local_58,(QPDFObjectHandle *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  QPDFWriter::QPDFWriter(&w,local_70,"a.pdf");
  QPDFWriter::setQDFMode(SUB81(&w,0));
  QPDFWriter::setStaticID(SUB81(&w,0));
  QPDFWriter::write();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&qtest.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&pages);
  return;
}

Assistant:

static void
test_55(QPDF& pdf, char const* arg2)
{
    // Form XObjects
    std::vector<QPDFPageObjectHelper> pages = QPDFPageDocumentHelper(pdf).getAllPages();
    QPDFObjectHandle qtest = QPDFObjectHandle::newArray();
    for (auto& ph: pages) {
        qtest.appendItem(ph.getFormXObjectForPage());
        qtest.appendItem(ph.getFormXObjectForPage(false));
    }
    pdf.getTrailer().replaceKey("/QTest", qtest);
    QPDFWriter w(pdf, "a.pdf");
    w.setQDFMode(true);
    w.setStaticID(true);
    w.write();
}